

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readParameters.hpp
# Opt level: O2

ResonanceParameters * __thiscall
njoy::ENDFtk::section::Type<32,151>::Isotope::
readParameters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ResonanceParameters *__return_storage_ptr__,Isotope *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LRU,int LRF,int LFW)

{
  undefined8 *puVar1;
  char *pcVar2;
  int MAT_00;
  int iVar3;
  undefined4 in_stack_fffffffffffffe6c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  start;
  undefined1 local_180 [288];
  ControlRecord cont;
  
  MAT_00 = (int)lineNumber;
  start._M_current = *(char **)this;
  iVar3 = MF;
  ControlRecord::ControlRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&cont,&start,begin,(long *)end,MAT_00,MAT,MF);
  if (MT == 2) {
    UnresolvedRelativeCovariances::
    UnresolvedRelativeCovariances<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((UnresolvedRelativeCovariances *)local_180,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
    ::
    variant<njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances,void,void,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances,void>
              ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                *)__return_storage_ptr__,(UnresolvedRelativeCovariances *)local_180);
    Type<32,_151>::UnresolvedRelativeCovariances::~UnresolvedRelativeCovariances
              ((UnresolvedRelativeCovariances *)local_180);
    return __return_storage_ptr__;
  }
  if (MT != 1) {
    tools::Log::error<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
    tools::Log::info<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
    pcVar2 = "LRU value: {}";
    LRU = MT;
LAB_001667b5:
    tools::Log::info<char_const*,int>(pcVar2,LRU);
LAB_001667ba:
    pcVar2 = end->_M_current;
LAB_001667c2:
    tools::Log::info<char_const*,long>("Line number: {}",(long)pcVar2);
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = getenv;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  if ((int)cont.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Head_base<3UL,_long,_false>._M_head_impl == 2) {
    switch(LRU) {
    case 1:
      CompactSingleLevelBreitWigner::
      CompactSingleLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((CompactSingleLevelBreitWigner *)local_180,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::
      variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
      ::
      variant<njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,void,void,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,void>
                ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                  *)__return_storage_ptr__,(CompactSingleLevelBreitWigner *)local_180);
      Type<32,_151>::
      CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactBreitWignerUncertainties,_double,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner>
      ::~CompactCovarianceBase
                ((CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactBreitWignerUncertainties,_double,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner>
                  *)local_180);
      return __return_storage_ptr__;
    case 2:
      CompactMultiLevelBreitWigner::
      CompactMultiLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((CompactMultiLevelBreitWigner *)local_180,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::
      variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
      ::
      variant<njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,void,void,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,void>
                ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                  *)__return_storage_ptr__,(CompactMultiLevelBreitWigner *)local_180);
      Type<32,_151>::
      CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactBreitWignerUncertainties,_double,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner>
      ::~CompactCovarianceBase
                ((CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactBreitWignerUncertainties,_double,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner>
                  *)local_180);
      return __return_storage_ptr__;
    case 3:
      CompactReichMoore::CompactReichMoore<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((CompactReichMoore *)local_180,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::
      variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
      ::
      variant<njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,void,void,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,void>
                ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                  *)__return_storage_ptr__,(CompactReichMoore *)local_180);
      Type<32,_151>::
      CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactReichMooreUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore>
      ::~CompactCovarianceBase
                ((CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactReichMooreUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore>
                  *)local_180);
      return __return_storage_ptr__;
    default:
      tools::Log::error<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
      break;
    case 7:
      CompactRMatrixLimited::
      CompactRMatrixLimited<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((CompactRMatrixLimited *)local_180,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::
      variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
      ::
      variant<njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,void,void,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,void>
                ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                  *)__return_storage_ptr__,(CompactRMatrixLimited *)local_180);
      Type<32,_151>::
      CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited>
      ::~CompactCovarianceBase
                ((CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited>
                  *)local_180);
      return __return_storage_ptr__;
    }
LAB_00166868:
    tools::Log::info<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
    pcVar2 = "LRF value: {}";
    goto LAB_001667b5;
  }
  if ((int)cont.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Head_base<3UL,_long,_false>._M_head_impl != 1) {
    if ((int)cont.
             super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl == 0) {
      if (LRU == 2) {
        LimitedMultiLevelBreitWigner::
        LimitedMultiLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((LimitedMultiLevelBreitWigner *)local_180,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,begin,(long *)end,MAT_00,MAT,MF);
        std::
        variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
        ::
        variant<njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,void,void,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,void>
                  ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                    *)__return_storage_ptr__,(LimitedMultiLevelBreitWigner *)local_180);
LAB_00166626:
        std::
        vector<njoy::ENDFtk::section::Type<32,_151>::LimitedBreitWignerLValue,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::LimitedBreitWignerLValue>_>
        ::~vector((vector<njoy::ENDFtk::section::Type<32,_151>::LimitedBreitWignerLValue,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::LimitedBreitWignerLValue>_>
                   *)(local_180 + 0x20));
        return __return_storage_ptr__;
      }
      if (LRU == 1) {
        LimitedSingleLevelBreitWigner::
        LimitedSingleLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((LimitedSingleLevelBreitWigner *)local_180,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,begin,(long *)end,MAT_00,MAT,MF);
        std::
        variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
        ::
        variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,void,void,njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,void>
                  ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                    *)__return_storage_ptr__,(LimitedSingleLevelBreitWigner *)local_180);
        goto LAB_00166626;
      }
      tools::Log::error<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
      tools::Log::info<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
      tools::Log::info<char_const*,int>("LRF value: {}",LRU);
      pcVar2 = end->_M_current;
      goto LAB_001667c2;
    }
    tools::Log::error<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
    tools::Log::info<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
    pcVar2 = "LCOMP value: {}";
    LRU = (int)cont.
               super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
               .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
    goto LAB_001667b5;
  }
  switch(LRU) {
  case 1:
    GeneralSingleLevelBreitWigner::
    GeneralSingleLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((GeneralSingleLevelBreitWigner *)local_180,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
    ::
    variant<njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,void,void,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,void>
              ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                *)__return_storage_ptr__,(GeneralSingleLevelBreitWigner *)local_180);
    Type<32,_151>::
    GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock,_double,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner>
    ::~GeneralCovarianceBase
              ((GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock,_double,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner>
                *)local_180);
    break;
  case 2:
    GeneralMultiLevelBreitWigner::
    GeneralMultiLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((GeneralMultiLevelBreitWigner *)local_180,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
    ::
    variant<njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,void,void,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,void>
              ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                *)__return_storage_ptr__,(GeneralMultiLevelBreitWigner *)local_180);
    Type<32,_151>::
    GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock,_double,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner>
    ::~GeneralCovarianceBase
              ((GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock,_double,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner>
                *)local_180);
    break;
  case 3:
    GeneralReichMoore::GeneralReichMoore<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((GeneralReichMoore *)local_180,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
    ::
    variant<njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,void,void,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,void>
              ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                *)__return_storage_ptr__,(GeneralReichMoore *)local_180);
    Type<32,_151>::
    GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeReichMooreBlock,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore>
    ::~GeneralCovarianceBase
              ((GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeReichMooreBlock,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore>
                *)local_180);
    break;
  default:
    tools::Log::error<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
    if (LRU != 4) goto LAB_00166868;
    tools::Log::info<char_const*>((char *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
    goto LAB_001667ba;
  case 7:
    GeneralRMatrixLimited::
    GeneralRMatrixLimited<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((GeneralRMatrixLimited *)local_180,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
    ::
    variant<njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,void,void,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,void>
              ((variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>
                *)__return_storage_ptr__,(GeneralRMatrixLimited *)local_180);
    Type<32,_151>::
    GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited>
    ::~GeneralCovarianceBase
              ((GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited>
                *)local_180);
  }
  return __return_storage_ptr__;
}

Assistant:

static ResonanceRange::ResonanceParameters
readParameters( Iterator& begin,
                const Iterator& end,
                long& lineNumber,
                int MAT,
                int MF,
                int MT,
                int LRU,
                int LRF,
                int LFW ) {

  Iterator start = begin;
  long current = lineNumber;
  ControlRecord cont( start, end, lineNumber, MAT, MF, MT );

  switch ( LRU ) {

    // resolved resonances
    case 1 : {

      int LCOMP = cont.L2();
      switch ( LCOMP ) {

        case 0: {

          switch ( LRF ) {

            case 1 : return LimitedSingleLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            case 2 : return LimitedMultiLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            default : {

              Log::error( "Encountered illegal LRF value for LCOMP = 0" );
              Log::info( "LRF is equal to 1 or 2" );
              Log::info( "LRF value: {}", LRF );
              Log::info( "Line number: {}", lineNumber );
              throw std::exception();
            }
          }
        }
        case 1: {

          switch ( LRF ) {

            case 1 : return GeneralSingleLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            case 2 : return GeneralMultiLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            case 3 : return GeneralReichMoore(
                                begin, end, lineNumber, MAT, MF, MT );
            case 7 : return GeneralRMatrixLimited(
                                begin, end, lineNumber, MAT, MF, MT );
            default : {

              Log::error( "Encountered illegal LRF value for LCOMP = 1" );
              if ( LRF != 4 ) {

                Log::info( "LRF is equal to 1, 2, 3, 4 or 7" );
                Log::info( "LRF value: {}", LRF );
              }
              else {

                Log::info( "LRF equal to 4 (Adler-Adler) is currently unsupported" );
              }
              Log::info( "Line number: {}", lineNumber );
              throw std::exception();
            }
          }
        }
        case 2 : {

          switch ( LRF ) {

            case 1 : return CompactSingleLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            case 2 : return CompactMultiLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            case 3 : return CompactReichMoore(
                                begin, end, lineNumber, MAT, MF, MT );
            case 7 : return CompactRMatrixLimited(
                                begin, end, lineNumber, MAT, MF, MT );
            default : {

              Log::error( "Encountered illegal LRF value for LCOMP = 2" );
              Log::info( "LRF is equal to 1, 2, 3 or 7" );
              Log::info( "LRF value: {}", LRF );
              Log::info( "Line number: {}", lineNumber );
              throw std::exception();
            }
          }
        }
        default : {

          Log::error( "Encountered illegal LCOMP value" );
          Log::info( "LCOMP is either 0 (limited), 1 (general) or 2 (compact)" );
          Log::info( "LCOMP value: {}", LCOMP );
          Log::info( "Line number: {}", lineNumber );
          throw std::exception();
        }
      }
    }
    case 2: {

      return UnresolvedRelativeCovariances( begin, end, lineNumber, MAT, MF, MT );
    }
    default : {

      Log::error( "Encountered illegal LRU value" );
      Log::info( "LRU should be 1 (resolved) or 2 (unresolved)" );
      Log::info( "LRU value: {}", LRU );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception();
    }
  }
}